

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void test_xor_lazy(_Bool copy_on_write)

{
  long lVar1;
  _Bool _Var2;
  roaring_bitmap_t *prVar3;
  roaring_bitmap_t *prVar4;
  roaring_bitmap_t *prVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ulong uVar8;
  roaring_bitmap_t **pprVar9;
  int i_1;
  uint32_t uVar10;
  ulong uVar11;
  char *__format;
  int iVar12;
  uint32_t i;
  roaring_bitmap_t *r [10];
  roaring_bitmap_t *local_88 [5];
  roaring_bitmap_t *local_60;
  roaring_bitmap_t *local_58;
  roaring_bitmap_t *local_50;
  roaring_bitmap_t *local_48;
  undefined8 local_40;
  
  uVar8 = 0;
  prVar3 = roaring_bitmap_create_with_capacity(0);
  (prVar3->high_low_container).flags = (prVar3->high_low_container).flags & 0xfe | copy_on_write;
  prVar4 = roaring_bitmap_create_with_capacity(0);
  (prVar4->high_low_container).flags = (prVar4->high_low_container).flags & 0xfe | copy_on_write;
  do {
    uVar10 = (uint32_t)uVar8;
    if ((uVar8 & 1) == 0) {
      roaring_bitmap_add(prVar3,uVar10);
    }
    if ((int)(uVar8 / 3) * 3 == uVar10) {
      roaring_bitmap_add(prVar4,uVar10);
    }
    uVar8 = (ulong)(uVar10 + 1);
  } while (uVar10 + 1 != 300);
  prVar5 = roaring_bitmap_lazy_xor(prVar3,prVar4);
  roaring_bitmap_repair_after_lazy(prVar5);
  (prVar5->high_low_container).flags = (prVar5->high_low_container).flags & 0xfe | copy_on_write;
  iVar12 = 0;
  uVar8 = 0;
  do {
    uVar10 = (uint32_t)uVar8;
    if (((int)(uVar8 / 6) * 6 == uVar10) || (((int)(uVar8 / 3) * 3 != uVar10 & (byte)uVar8) != 0)) {
      _Var2 = roaring_bitmap_contains(prVar5,uVar10);
      __format = "surplus %d\n";
      if (_Var2) goto LAB_00106421;
    }
    else {
      iVar12 = iVar12 + 1;
      _Var2 = roaring_bitmap_contains(prVar5,uVar10);
      __format = "missing %d\n";
      if (!_Var2) {
LAB_00106421:
        printf(__format,uVar8);
      }
    }
    uVar8 = (ulong)(uVar10 + 1);
    if (uVar10 + 1 == 300) {
      uVar6 = roaring_bitmap_get_cardinality(prVar5);
      _assert_int_equal(uVar6,(long)iVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/toplevel_unit.c"
                        ,0x80b);
      roaring_bitmap_free(prVar5);
      roaring_bitmap_free(prVar4);
      roaring_bitmap_free(prVar3);
      local_88[0] = gen_bitmap(0.0,1e-06,1,0,0,1000000);
      local_88[1] = gen_bitmap(1.0,-1e-06,1,0,0,1000000);
      local_88[2] = gen_bitmap(1e-05,0.0,1,0,0,2000000);
      local_88[3] = gen_bitmap(1e-05,0.0,3,0,0,2000000);
      local_88[4] = gen_bitmap(0.1,0.0,1,0,0,2000000);
      local_60 = gen_bitmap(0.001,1e-07,1,0,0,1000000);
      local_58 = gen_bitmap(0.0,1e-10,1,0,0,1000000);
      local_50 = gen_bitmap(0.5,-1e-06,1,600000,800000,1000000);
      local_48 = gen_bitmap(1.0,-1e-06,1,300000,500000,1000000);
      local_40 = 0;
      if (local_88[0] != (roaring_bitmap_t *)0x0) {
        uVar8 = 0;
        prVar3 = local_88[0];
        do {
          prVar4 = local_88[uVar8];
          uVar11 = uVar8;
          while (prVar4 != (roaring_bitmap_t *)0x0) {
            prVar5 = synthesized_xor(prVar3,prVar4);
            prVar4 = roaring_bitmap_lazy_xor(prVar3,prVar4);
            roaring_bitmap_repair_after_lazy(prVar4);
            _Var2 = roaring_bitmap_equals(prVar5,prVar4);
            if (!_Var2) {
              printf("problem with i=%d j=%d\n",uVar8,uVar11 & 0xffffffff);
              uVar6 = roaring_bitmap_get_cardinality(prVar4);
              uVar7 = roaring_bitmap_get_cardinality(prVar5);
              printf("result\'s cardinality  is %d and expected\'s is %d\n",uVar6 & 0xffffffff,
                     uVar7 & 0xffffffff);
              show_difference(prVar4,prVar5);
            }
            _assert_true((ulong)_Var2,"is_equal",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/toplevel_unit.c"
                         ,0x838);
            roaring_bitmap_free(prVar5);
            roaring_bitmap_free(prVar4);
            lVar1 = uVar11 + 1;
            uVar11 = uVar11 + 1;
            prVar4 = local_88[lVar1];
          }
          prVar3 = local_88[uVar8 + 1];
          uVar8 = uVar8 + 1;
        } while (prVar3 != (roaring_bitmap_t *)0x0);
      }
      if (local_88[0] != (roaring_bitmap_t *)0x0) {
        pprVar9 = local_88;
        prVar3 = local_88[0];
        do {
          pprVar9 = pprVar9 + 1;
          roaring_bitmap_free(prVar3);
          prVar3 = *pprVar9;
        } while (prVar3 != (roaring_bitmap_t *)0x0);
      }
      return;
    }
  } while( true );
}

Assistant:

void test_xor_lazy(bool copy_on_write) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r2, copy_on_write);

    for (uint32_t i = 0; i < 300; ++i) {
        if (i % 2 == 0) roaring_bitmap_add(r1, i);
        if (i % 3 == 0) roaring_bitmap_add(r2, i);
    }

    roaring_bitmap_t *r1_xor_r2 = roaring_bitmap_lazy_xor(r1, r2);
    roaring_bitmap_repair_after_lazy(r1_xor_r2);

    roaring_bitmap_set_copy_on_write(r1_xor_r2, copy_on_write);

    int ansctr = 0;
    for (int i = 0; i < 300; ++i) {
        if (((i % 2 == 0) || (i % 3 == 0)) && (i % 6 != 0)) {
            ansctr++;
            if (!roaring_bitmap_contains(r1_xor_r2, i))
                printf("missing %d\n", i);
        } else if (roaring_bitmap_contains(r1_xor_r2, i))
            printf("surplus %d\n", i);
    }

    assert_int_equal(roaring_bitmap_get_cardinality(r1_xor_r2), ansctr);

    roaring_bitmap_free(r1_xor_r2);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r1);

    // some tougher tests on synthetic data
    roaring_bitmap_t *r[] = {
        // ascending density, last containers might be runs
        gen_bitmap(0.0, 1e-6, 1, 0, 0, 1000000),
        // descending density, first containers might be runs
        gen_bitmap(1.0, -1e-6, 1, 0, 0, 1000000),
        // uniformly rather sparse
        gen_bitmap(1e-5, 0.0, 1, 0, 0, 2000000),
        // uniformly rather sparse with runs
        gen_bitmap(1e-5, 0.0, 3, 0, 0, 2000000),
        // uniformly rather dense
        gen_bitmap(1e-1, 0.0, 1, 0, 0, 2000000),
        // ascending density but never too dense
        gen_bitmap(0.001, 1e-7, 1, 0, 0, 1000000),
        // ascending density but very sparse
        gen_bitmap(0.0, 1e-10, 1, 0, 0, 1000000),
        // descending with a gap
        gen_bitmap(0.5, -1e-6, 1, 600000, 800000, 1000000),
        //  gap elsewhere
        gen_bitmap(1, -1e-6, 1, 300000, 500000, 1000000),
        0  // sentinel
    };

    for (int i = 0; r[i]; ++i) {
        for (int j = i; r[j]; ++j) {
            roaring_bitmap_t *expected = synthesized_xor(r[i], r[j]);

            roaring_bitmap_t *result = roaring_bitmap_lazy_xor(r[i], r[j]);
            roaring_bitmap_repair_after_lazy(result);

            bool is_equal = roaring_bitmap_equals(expected, result);
            if (!is_equal) {
                printf("problem with i=%d j=%d\n", i, j);
                printf("result's cardinality  is %d and expected's is %d\n",
                       (int)roaring_bitmap_get_cardinality(result),
                       (int)roaring_bitmap_get_cardinality(expected));
                show_difference(result, expected);
            }

            assert_true(is_equal);
            roaring_bitmap_free(expected);
            roaring_bitmap_free(result);
        }
    }
    for (int i = 0; r[i]; ++i) roaring_bitmap_free(r[i]);
}